

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void freeobj(lua_State *L,GCObject *o)

{
  GCObject *o_local;
  lua_State *L_local;
  
  switch((o->gch).tt) {
  case '\x04':
    (L->l_G->strt).nuse = (L->l_G->strt).nuse - 1;
  case '\x14':
    luaM_realloc_(L,o,(size_t)((long)&(o->h).array[1].tt_ + 1),0);
    break;
  case '\x05':
    luaH_free(L,&o->h);
    break;
  case '\x06':
    luaM_realloc_(L,o,(long)(int)(((o->h).flags - 1) * 8 + 0x28),0);
    break;
  case '\a':
    luaM_realloc_(L,o,(size_t)((o->h).lastfree + 1),0);
    break;
  case '\b':
    luaE_freethread(L,&o->th);
    break;
  case '\t':
    luaF_freeproto(L,&o->p);
    break;
  case '\n':
    luaF_freeupval(L,&o->uv);
    break;
  default:
    break;
  case '&':
    luaM_realloc_(L,o,(long)(int)(((o->h).flags - 1) * 0x10 + 0x30),0);
  }
  return;
}

Assistant:

static void freeobj (lua_State *L, GCObject *o) {
  switch (gch(o)->tt) {
    case LUA_TPROTO: luaF_freeproto(L, gco2p(o)); break;
    case LUA_TLCL: {
      luaM_freemem(L, o, sizeLclosure(gco2lcl(o)->nupvalues));
      break;
    }
    case LUA_TCCL: {
      luaM_freemem(L, o, sizeCclosure(gco2ccl(o)->nupvalues));
      break;
    }
    case LUA_TUPVAL: luaF_freeupval(L, gco2uv(o)); break;
    case LUA_TTABLE: luaH_free(L, gco2t(o)); break;
    case LUA_TTHREAD: luaE_freethread(L, gco2th(o)); break;
    case LUA_TUSERDATA: luaM_freemem(L, o, sizeudata(gco2u(o))); break;
    case LUA_TSHRSTR:
      G(L)->strt.nuse--;
      /* go through */
    case LUA_TLNGSTR: {
      luaM_freemem(L, o, sizestring(gco2ts(o)));
      break;
    }
    default: lua_assert(0);
  }
}